

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::MarkOrCopyLine_LINEBREAK(FlowBuffer *this)

{
  const_byteptr data;
  const_byteptr puVar1;
  long lVar2;
  
  data = this->orig_data_begin_;
  if ((data != (const_byteptr)0x0) && (puVar1 = this->orig_data_end_, puVar1 != (const_byteptr)0x0))
  {
    lVar2 = 0;
    while( true ) {
      if (puVar1 <= data + lVar2) {
        AppendToBuffer(this,data,(int)puVar1 - (int)data);
        return;
      }
      if (data[lVar2] == this->linebreaker_) break;
      lVar2 = lVar2 + 1;
    }
    if (this->buffer_n_ == 0) {
      this->frame_length_ = (int)lVar2;
    }
    else {
      AppendToBuffer(this,data,(int)lVar2 + 1);
      this->buffer_n_ = this->buffer_n_ + -1;
    }
    this->message_complete_ = true;
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyLine_LINEBREAK()
	{
	if ( ! (orig_data_begin_ && orig_data_end_) )
		return;

	const_byteptr data;
	for ( data = orig_data_begin_; data < orig_data_end_; ++data )
		{
		if ( *data == linebreaker_ )
			goto found_end_of_line;
		}

	AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
	return;

found_end_of_line:
	if ( buffer_n_ == 0 )
		{
		frame_length_ = data - orig_data_begin_;
		}
	else
		{
		AppendToBuffer(orig_data_begin_, data + 1 - orig_data_begin_);
		// But eliminate the last 'linebreaker' character
		--buffer_n_;
		}
	message_complete_ = true;

#if DEBUG_FLOW_BUFFER
	fprintf(stderr, "%.6f Line complete: [%s]\n", network_time(),
	        string((const char*)begin(), (const char*)end()).c_str());
#endif
	}